

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall CaDiCaL::Solver::trace_proof(Solver *this,char *path)

{
  FILE *pFVar1;
  Internal *this_00;
  External *this_01;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar2;
  File *file;
  undefined8 extraout_RAX;
  undefined8 in_RCX;
  char *pcVar4;
  size_t __n;
  Solver *this_02;
  bool bVar5;
  int iVar3;
  
  bVar5 = this->internal == (Internal *)0x0;
  pFVar1 = (FILE *)this->trace_api_file;
  pcVar4 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),pFVar1 == (FILE *)0x0 || bVar5);
  if (pFVar1 != (FILE *)0x0 && !bVar5) {
    pcVar4 = path;
    fprintf(pFVar1,"%s %s\n","trace_proof");
    fflush((FILE *)this->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"bool CaDiCaL::Solver::trace_proof(const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar4);
  if (this->external == (External *)0x0) {
    trace_proof();
LAB_0085d4b8:
    trace_proof();
LAB_0085d4bd:
    trace_proof();
  }
  else {
    if (this->internal == (Internal *)0x0) goto LAB_0085d4b8;
    if ((this->_state & VALID) == 0) goto LAB_0085d4bd;
    if (this->_state == CONFIGURING) {
      file = (File *)File::write((int)this->internal,path,__n);
      Internal::trace(this->internal,file);
      return file != (File *)0x0;
    }
  }
  trace_proof((Solver *)path);
  bVar5 = ((Solver *)path)->internal == (Internal *)0x0;
  pFVar1 = (FILE *)((Solver *)path)->trace_api_file;
  pcVar4 = (char *)CONCAT71((int7)((ulong)pcVar4 >> 8),pFVar1 == (FILE *)0x0 || bVar5);
  if (pFVar1 != (FILE *)0x0 && !bVar5) {
    fprintf(pFVar1,"%s\n","reset");
    fflush((FILE *)((Solver *)path)->trace_api_file);
  }
  this_02 = (Solver *)path;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)path,"CaDiCaL::Solver::~Solver()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar4);
  if (((Solver *)path)->external == (External *)0x0) {
    fatal_message_start();
    ~Solver(this_02);
  }
  else {
    this_00 = ((Solver *)path)->internal;
    if (this_00 != (Internal *)0x0) {
      if ((((Solver *)path)->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) !=
          0) {
        if (((Solver *)path)->_state != DELETING) {
          ((Solver *)path)->_state = DELETING;
        }
        tracing_nb_lidrup_env_var_method = 0;
        Internal::~Internal(this_00);
        operator_delete(this_00,0x1c78);
        this_01 = ((Solver *)path)->external;
        uVar2 = extraout_AL;
        if (this_01 != (External *)0x0) {
          External::~External(this_01);
          operator_delete(this_01,0x238);
          uVar2 = extraout_AL_00;
        }
        if (((Solver *)path)->close_trace_api_file == true) {
          ((Solver *)path)->close_trace_api_file = false;
          iVar3 = fclose((FILE *)((Solver *)path)->trace_api_file);
          uVar2 = (undefined1)iVar3;
          tracing_api_calls_through_environment_variable_method = 0;
        }
        return (bool)uVar2;
      }
      goto LAB_0085d5af;
    }
  }
  fatal_message_start();
  ~Solver(this_02);
LAB_0085d5af:
  fatal_message_start();
  ~Solver(this_02);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

bool Solver::trace_proof (const char *path) {
  TRACE ("trace_proof", path);
  REQUIRE_VALID_STATE ();
  REQUIRE (
      state () == CONFIGURING,
      "can only start proof tracing to '%s' right after initialization",
      path);
  File *internal_file = File::write (internal, path);
  bool res = (internal_file != 0);
  internal->trace (internal_file);
  LOG_API_CALL_RETURNS ("trace_proof", path, res);
  return res;
}